

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

idx_t __thiscall
duckdb::CSVErrorHandler::GetLineInternal(CSVErrorHandler *this,LinesPerBoundary *error_info)

{
  mapped_type *pmVar1;
  idx_t iVar2;
  ulong local_28;
  
  iVar2 = error_info->lines_in_batch + 1;
  for (local_28 = 0; local_28 < error_info->boundary_idx; local_28 = local_28 + 1) {
    pmVar1 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->lines_per_batch_map,&local_28);
    iVar2 = iVar2 + pmVar1->lines_in_batch;
  }
  return iVar2;
}

Assistant:

idx_t CSVErrorHandler::GetLineInternal(const LinesPerBoundary &error_info) {
	// We start from one, since the lines are 1-indexed
	idx_t current_line = 1 + error_info.lines_in_batch;
	for (idx_t boundary_idx = 0; boundary_idx < error_info.boundary_idx; boundary_idx++) {
		current_line += lines_per_batch_map[boundary_idx].lines_in_batch;
	}
	return current_line;
}